

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# footest.cpp
# Opt level: O2

Result __thiscall anon_unknown.dwarf_1507c::MockBoo::BooMethod(MockBoo *this)

{
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            (&(this->gmock00_BooMethod_10).super_UntypedFunctionMockerBase,this,"BooMethod");
  testing::internal::FunctionMocker<void_()>::Invoke(&this->gmock00_BooMethod_10);
  return;
}

Assistant:

TEST(FooTest, Simple)
  {
    using ::testing::AtLeast;

    MockBoo boo;
    EXPECT_CALL(boo, BooMethod())
      .Times(AtLeast(1));

    Foo foo;
    foo.CallBooMethod(boo);
  }